

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O2

void Fra_AddClausesSuper(Fra_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  int iVar1;
  lit *begin;
  void *pvVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0x85,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pNode->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0x86,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  lVar3 = (long)vSuper->nSize;
  begin = (lit *)malloc(lVar3 * 4 + 4);
  iVar4 = 0;
  while (iVar1 = vSuper->nSize, iVar4 < iVar1) {
    pvVar2 = Vec_PtrEntry(vSuper,iVar4);
    *begin = ((uint)pvVar2 & 1) +
             *(int *)(*(long *)(*(long *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x28) + 0x98) +
                     (long)*(int *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x24) * 4) * 2;
    begin[1] = *(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) * 2 +
               1;
    iVar1 = sat_solver_addclause(p->pSat,begin,begin + 2);
    iVar4 = iVar4 + 1;
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                    ,0x91,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
  }
  for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
    pvVar2 = Vec_PtrEntry(vSuper,(int)lVar5);
    begin[lVar5] = ((uint)pvVar2 & 1) +
                   *(int *)(*(long *)(*(long *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x28) + 0x98)
                           + (long)*(int *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x24) * 4) * 2 ^
                   1;
    iVar1 = vSuper->nSize;
  }
  begin[lVar3] = *(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) * 2;
  iVar4 = sat_solver_addclause(p->pSat,begin,begin + lVar3 + 1);
  if (iVar4 != 0) {
    free(begin);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                ,0x98,"void Fra_AddClausesSuper(Fra_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Fra_AddClausesSuper( Fra_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Fra_ObjSatNum(Aig_Regular(pFanin)), Aig_IsComplement(pFanin));
        pLits[1] = toLitCond(Fra_ObjSatNum(pNode), 1);
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
        pLits[i] = toLitCond(Fra_ObjSatNum(Aig_Regular(pFanin)), !Aig_IsComplement(pFanin));
    pLits[nLits-1] = toLitCond(Fra_ObjSatNum(pNode), 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}